

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_base64.hxx
# Opt level: O3

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 cryptox::
 to_base64<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::__cxx11::string>>
           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            first,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  last,
           back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           d_first)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  uint8_t input [128];
  uint8_t output [160];
  uchar local_158 [128];
  uchar local_d8 [168];
  
  if (first._M_current != last._M_current) {
    do {
      uVar4 = 0;
      do {
        uVar1 = uVar4 + 1;
        local_158[uVar4] = first._M_current[uVar4];
        if (0x7e < uVar4) break;
        lVar2 = uVar4 + 1;
        uVar4 = uVar1;
      } while (first._M_current + lVar2 != last._M_current);
      uVar3 = EVP_EncodeBlock(local_d8,local_158,(int)uVar1);
      if (0 < (int)uVar3) {
        uVar4 = 0;
        do {
          std::__cxx11::string::push_back((char)d_first.container);
          uVar4 = uVar4 + 1;
        } while (uVar3 != uVar4);
      }
      first._M_current = first._M_current + uVar1;
    } while (first._M_current != last._M_current);
  }
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )d_first.container;
}

Assistant:

Output to_base64(Input first, Input last, Output d_first) {
		while (first != last) {
			std::uint8_t input[128];
			size_t input_size = 0;
			while (input_size < sizeof(input) && first != last)
				input[input_size++] = *first++;

			std::uint8_t output[160];
			const size_t output_size = EVP_EncodeBlock(output,
			                                           input,
			                                           input_size);

			d_first = std::copy(output, output + output_size, d_first);
		}

		return d_first;
	}